

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserBoxShadow.cpp
# Opt level: O1

bool __thiscall
Rml::PropertyParserBoxShadow::ParseValue
          (PropertyParserBoxShadow *this,Property *property,String *value,ParameterMap *param_3)

{
  pointer pcVar1;
  pointer pBVar2;
  pointer pbVar3;
  int iVar4;
  int iVar5;
  NumericValue NVar6;
  String *pSVar7;
  uint uVar8;
  char cVar9;
  pointer pbVar10;
  char cVar11;
  pointer string;
  bool bVar12;
  BoxShadowList shadow_list;
  StringList arguments;
  StringList shadows_string_list;
  String lowercase_value;
  ParameterMap empty_parameter_map;
  Colour<unsigned_char,_255,_false> local_14c;
  vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> local_148;
  StringList local_128;
  StringList local_108;
  PropertyParserBoxShadow *local_e8;
  Property *local_e0;
  String *local_d8;
  String local_d0;
  undefined1 local_b0 [32];
  char acStack_90 [4];
  uint uStack_8c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_e8 = this;
  if ((value->_M_string_length == 0) ||
     (iVar4 = ::std::__cxx11::string::compare((char *)value), iVar4 == 0)) {
    Variant::Variant((Variant *)local_b0);
    Variant::operator=(&property->value,(Variant *)local_b0);
    Variant::~Variant((Variant *)local_b0);
    property->unit = UNKNOWN;
    bVar12 = true;
  }
  else {
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (String *)0x0;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (String *)0x0;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar1 = (value->_M_dataplus)._M_p;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar1,pcVar1 + value->_M_string_length);
    StringUtilities::ToLower(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    StringUtilities::ExpandString(&local_108,(String *)local_b0,',','(',')',false);
    if ((undefined1 *)CONCAT44(local_b0._4_4_,local_b0._0_4_) != local_b0 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_b0._4_4_,local_b0._0_4_),
                      CONCAT44(local_b0._20_4_,local_b0._16_4_) + 1);
    }
    if (local_108.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_108.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar12 = false;
    }
    else {
      local_60.mKeyVals = (Node *)&local_60.mMask;
      local_60.mNumElements = 0;
      local_60.mMask = 0;
      local_60.mMaxNumElementsAllowed = 0;
      local_60.mInfoInc = 0x20;
      local_60.mInfoHashShift = 0;
      local_148.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (BoxShadow *)0x0;
      local_148.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_148.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
      super__Vector_impl_data._M_finish = (BoxShadow *)0x0;
      local_60.mInfo = (uint8_t *)local_60.mKeyVals;
      ::std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::reserve
                (&local_148,
                 (long)local_108.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_108.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      if (local_108.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_108.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar12 = true;
      }
      else {
        local_d8 = local_108.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        pSVar7 = local_108.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        string = local_108.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_e0 = property;
        do {
          local_128.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_128.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_128.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          StringUtilities::ExpandString(&local_128,string,' ','(',')',false);
          if (local_128.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_128.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            cVar9 = '\x01';
          }
          else {
            local_b0._0_4_ = 0xff000000;
            local_b0._20_4_ = 0;
            local_b0._24_4_ = 0;
            local_b0._28_4_ = 0;
            acStack_90[0] = '\0';
            acStack_90[1] = '\0';
            acStack_90[2] = '\0';
            acStack_90[3] = '\0';
            local_b0._4_4_ = 0;
            local_b0[8] = '\0';
            local_b0[9] = '\0';
            local_b0[10] = '\0';
            local_b0[0xb] = '\0';
            local_b0[0xc] = '\0';
            local_b0[0xd] = '\0';
            local_b0[0xe] = '\0';
            local_b0[0xf] = '\0';
            local_b0._16_4_ = 0;
            uStack_8c = uStack_8c & 0xffffff00;
            if (local_148.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_148.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::
              _M_realloc_insert<Rml::BoxShadow>
                        (&local_148,
                         (iterator)
                         local_148.
                         super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl
                         .super__Vector_impl_data._M_finish,(BoxShadow *)local_b0);
            }
            else {
              *(ulong *)&((local_148.
                           super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->spread_distance).unit =
                   (ulong)uStack_8c << 0x20;
              *(undefined8 *)
               &((local_148.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->offset_y).unit = 0;
              *(undefined8 *)
               &((local_148.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->blur_radius).unit = 0;
              ((local_148.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>.
                _M_impl.super__Vector_impl_data._M_finish)->color).red = '\0';
              ((local_148.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>.
                _M_impl.super__Vector_impl_data._M_finish)->color).green = '\0';
              ((local_148.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>.
                _M_impl.super__Vector_impl_data._M_finish)->color).blue = '\0';
              ((local_148.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>.
                _M_impl.super__Vector_impl_data._M_finish)->color).alpha = 0xff;
              ((local_148.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>.
                _M_impl.super__Vector_impl_data._M_finish)->offset_x).number = 0.0;
              *(undefined8 *)
               &((local_148.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->offset_x).unit = 0;
              local_148.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_148.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            pbVar3 = local_128.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pBVar2 = local_148.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if (local_128.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_128.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              cVar11 = '\x04';
              cVar9 = true;
            }
            else {
              iVar4 = 0;
              pbVar10 = local_128.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              do {
                if (pbVar10->_M_string_length == 0) {
                  cVar11 = '\x05';
                }
                else {
                  Property::Property((Property *)local_b0);
                  iVar5 = (*local_e8->parser_length->_vptr_PropertyParser[2])
                                    (local_e8->parser_length,(Property *)local_b0,pbVar10,&local_60)
                  ;
                  if ((char)iVar5 == '\0') {
                    iVar5 = ::std::__cxx11::string::compare((char *)pbVar10);
                    if (iVar5 == 0) {
                      pBVar2[-1].inset = true;
                    }
                    else {
                      iVar5 = (*local_e8->parser_color->_vptr_PropertyParser[2])
                                        (local_e8->parser_color,(Property *)local_b0,pbVar10,
                                         &local_60);
                      cVar11 = '\x01';
                      if ((char)iVar5 == '\0') goto LAB_00254b36;
                      local_14c.red = '\0';
                      local_14c.green = '\0';
                      local_14c.blue = '\0';
                      local_14c.alpha = 0xff;
                      Variant::GetInto<Rml::Colour<unsigned_char,_255,_false>,_0>
                                ((Variant *)local_b0,&local_14c);
                      uVar8 = (uint)local_14c >> 0x18;
                      pBVar2[-1].color =
                           (ColourbPremultiplied)
                           ((((uint)local_14c & 0xff) * uVar8) / 0xff & 0xff |
                            (uint)local_14c & 0xff000000 |
                            ((((uint)local_14c >> 0x10 & 0xff) * uVar8) / 0xff & 0xff) << 0x10 |
                           ((((uint)local_14c >> 8 & 0xff) * uVar8) / 0xff & 0xff) << 8);
                    }
                  }
                  else {
                    switch(iVar4) {
                    case 0:
                      NVar6 = Property::GetNumericValue((Property *)local_b0);
                      pBVar2[-1].offset_x = NVar6;
                      break;
                    case 1:
                      NVar6 = Property::GetNumericValue((Property *)local_b0);
                      pBVar2[-1].offset_y = NVar6;
                      break;
                    case 2:
                      NVar6 = Property::GetNumericValue((Property *)local_b0);
                      pBVar2[-1].blur_radius = NVar6;
                      break;
                    case 3:
                      NVar6 = Property::GetNumericValue((Property *)local_b0);
                      pBVar2[-1].spread_distance = NVar6;
                      break;
                    default:
                      cVar11 = '\x01';
                      goto LAB_00254b36;
                    }
                    iVar4 = iVar4 + 1;
                  }
                  cVar11 = '\0';
LAB_00254b36:
                  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
                  }
                  Variant::~Variant((Variant *)local_b0);
                }
                if ((cVar11 != '\x05') && (cVar11 != '\0')) goto LAB_00254b78;
                pbVar10 = pbVar10 + 1;
              } while (pbVar10 != pbVar3);
              cVar11 = '\x04';
LAB_00254b78:
              cVar9 = iVar4 < 2;
              pSVar7 = local_d8;
            }
            if (cVar11 != '\x04') {
              cVar9 = cVar11;
            }
          }
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_128);
          if (cVar9 != '\0') goto LAB_00254bc5;
          string = string + 1;
        } while (string != pSVar7);
        cVar9 = '\x02';
LAB_00254bc5:
        bVar12 = cVar9 == '\x02';
        property = local_e0;
      }
      if (bVar12) {
        property->unit = BOXSHADOWLIST;
        local_b0._0_4_ = NONE;
        local_b0._4_4_ = 0;
        Variant::Set((Variant *)local_b0,&local_148);
        Variant::operator=(&property->value,(Variant *)local_b0);
        Variant::~Variant((Variant *)local_b0);
      }
      if (local_148.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_148.
                        super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_148.
                              super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_148.
                              super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      robin_hood::detail::
      Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::destroy(&local_60);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_108);
  }
  return bVar12;
}

Assistant:

bool PropertyParserBoxShadow::ParseValue(Property& property, const String& value, const ParameterMap& /*parameters*/) const
{
	if (value.empty() || value == "none")
	{
		property.value = Variant();
		property.unit = Unit::UNKNOWN;
		return true;
	}

	StringList shadows_string_list;
	{
		auto lowercase_value = StringUtilities::ToLower(value);
		StringUtilities::ExpandString(shadows_string_list, lowercase_value, ',', '(', ')');
	}

	if (shadows_string_list.empty())
		return false;

	const ParameterMap empty_parameter_map;

	BoxShadowList shadow_list;
	shadow_list.reserve(shadows_string_list.size());

	for (const String& shadow_str : shadows_string_list)
	{
		StringList arguments;
		StringUtilities::ExpandString(arguments, shadow_str, ' ', '(', ')');
		if (arguments.empty())
			return false;

		shadow_list.push_back({});
		BoxShadow& shadow = shadow_list.back();

		int length_argument_index = 0;

		for (const String& argument : arguments)
		{
			if (argument.empty())
				continue;

			Property prop;
			if (parser_length->ParseValue(prop, argument, empty_parameter_map))
			{
				switch (length_argument_index)
				{
				case 0: shadow.offset_x = prop.GetNumericValue(); break;
				case 1: shadow.offset_y = prop.GetNumericValue(); break;
				case 2: shadow.blur_radius = prop.GetNumericValue(); break;
				case 3: shadow.spread_distance = prop.GetNumericValue(); break;
				default: return false;
				}
				length_argument_index += 1;
			}
			else if (argument == "inset")
			{
				shadow.inset = true;
			}
			else if (parser_color->ParseValue(prop, argument, empty_parameter_map))
			{
				shadow.color = prop.Get<Colourb>().ToPremultiplied();
			}
			else
			{
				return false;
			}
		}

		if (length_argument_index < 2)
			return false;
	}

	property.unit = Unit::BOXSHADOWLIST;
	property.value = Variant(std::move(shadow_list));

	return true;
}